

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPrimal.cpp
# Opt level: O0

void __thiscall HPrimal::primalUpdate(HPrimal *this)

{
  double dVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  int *piVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  HMatrix *this_00;
  HVector *row_ap;
  int *piVar12;
  reference pvVar13;
  reference pvVar14;
  HModel *in_RDI;
  double dVar15;
  double dVar16;
  HModel *pHVar17;
  int iCol_1;
  int iGet;
  int i_2;
  int iCol;
  int i_1;
  double thetaDual;
  int iRow;
  int sourceOut;
  int index;
  int i;
  bool flipped;
  double valueIn;
  double upperIn;
  double lowerIn;
  double thetaPrimal;
  double alpha;
  int columnOut;
  int moveIn;
  double primalTolerance;
  double *baseValue;
  double *workValue;
  double *baseUpper;
  double *baseLower;
  double *workUpper;
  double *workLower;
  double *workDual;
  int *jMove;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  HModel *in_stack_ffffffffffffff20;
  HModel *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  value_type vVar18;
  HVector *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int iVar19;
  HModel *in_stack_ffffffffffffff60;
  int local_94;
  int local_88;
  HVector *local_68;
  HVector *row_ep;
  
  piVar6 = HModel::getNonbasicMove((HModel *)0x189685);
  pdVar7 = HModel::getWorkDual((HModel *)0x18969e);
  pdVar8 = HModel::getWorkLower((HModel *)0x1896b7);
  pdVar9 = HModel::getWorkUpper((HModel *)0x1896d0);
  pdVar10 = HModel::getBaseLower((HModel *)0x1896e9);
  pdVar11 = HModel::getBaseUpper((HModel *)0x189702);
  this_00 = (HMatrix *)HModel::getWorkValue((HModel *)0x18971b);
  row_ap = (HVector *)HModel::getBaseValue((HModel *)0x189734);
  row_ep = *(HVector **)(*(pointer *)(in_RDI->intOption + 6) + 10);
  iVar19 = piVar6[*(int *)((vector<double,_std::allocator<double>_> *)in_RDI->dblOption + 1)];
  piVar12 = HModel::getBaseIndex((HModel *)0x189775);
  iVar3 = piVar12[*(int *)((long)((vector<double,_std::allocator<double>_> *)in_RDI->dblOption + 1)
                          + 4)];
  pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)((in_RDI->timer).itemTicks + 0xf),
                       (long)*(int *)((long)((vector<double,_std::allocator<double>_> *)
                                             in_RDI->dblOption + 1) + 4));
  dVar1 = *pvVar13;
  if (dVar1 * (double)iVar19 <= 0.0) {
    dVar15 = *(double *)
              (&row_ap->size +
              (long)*(int *)((long)((vector<double,_std::allocator<double>_> *)in_RDI->dblOption + 1
                                   ) + 4) * 2) -
             pdVar11[*(int *)((long)((vector<double,_std::allocator<double>_> *)in_RDI->dblOption +
                                    1) + 4)];
  }
  else {
    dVar15 = *(double *)
              (&row_ap->size +
              (long)*(int *)((long)((vector<double,_std::allocator<double>_> *)in_RDI->dblOption + 1
                                   ) + 4) * 2) -
             pdVar10[*(int *)((long)((vector<double,_std::allocator<double>_> *)in_RDI->dblOption +
                                    1) + 4)];
  }
  local_68 = (HVector *)(dVar15 / dVar1);
  dVar15 = pdVar8[*(int *)((vector<double,_std::allocator<double>_> *)in_RDI->dblOption + 1)];
  dVar2 = pdVar9[*(int *)((vector<double,_std::allocator<double>_> *)in_RDI->dblOption + 1)];
  dVar16 = *(double *)
            (&this_00->numCol +
            (long)*(int *)((vector<double,_std::allocator<double>_> *)in_RDI->dblOption + 1) * 2) +
           (double)local_68;
  bVar4 = false;
  if (piVar6[*(int *)((vector<double,_std::allocator<double>_> *)in_RDI->dblOption + 1)] == 1) {
    bVar4 = dVar2 + (double)row_ep < dVar16;
    if (bVar4) {
      *(double *)
       (&this_00->numCol +
       (long)*(int *)((vector<double,_std::allocator<double>_> *)in_RDI->dblOption + 1) * 2) = dVar2
      ;
      local_68 = (HVector *)(dVar2 - dVar15);
      piVar6[*(int *)((vector<double,_std::allocator<double>_> *)in_RDI->dblOption + 1)] = -1;
    }
  }
  else if ((piVar6[*(int *)((vector<double,_std::allocator<double>_> *)in_RDI->dblOption + 1)] == -1
           ) && (bVar4 = dVar16 < dVar15 - (double)row_ep, bVar4)) {
    *(double *)
     (&this_00->numCol +
     (long)*(int *)((vector<double,_std::allocator<double>_> *)in_RDI->dblOption + 1) * 2) = dVar15;
    local_68 = (HVector *)(dVar15 - dVar2);
    piVar6[*(int *)((vector<double,_std::allocator<double>_> *)in_RDI->dblOption + 1)] = 1;
  }
  for (local_88 = 0; local_88 < *(int *)((long)(in_RDI->timer).itemTicks + 0x5c);
      local_88 = local_88 + 1) {
    pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)((in_RDI->timer).itemTicks + 0xc),
                         (long)local_88);
    iVar19 = *pvVar14;
    in_stack_ffffffffffffff38 = local_68;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)
                         ((in_RDI->timer).itemTicks + 0xf),(long)iVar19);
    *(double *)(&row_ap->size + (long)iVar19 * 2) =
         -(double)in_stack_ffffffffffffff38 * *pvVar13 +
         *(double *)(&row_ap->size + (long)iVar19 * 2);
  }
  if (!bVar4) {
    HModel::updatePivots
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
               in_stack_ffffffffffffff54);
    *(double *)
     (&row_ap->size +
     (long)*(int *)((long)((vector<double,_std::allocator<double>_> *)in_RDI->dblOption + 1) + 4) *
     2) = dVar16;
    for (local_94 = 0;
        local_94 <
        *(int *)((long)&(((vector<double,_std::allocator<double>_> *)in_RDI->dblOption)->
                        super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + 4); local_94 = local_94 + 1) {
      if (pdVar10[local_94] - (double)row_ep <= *(double *)(&row_ap->size + (long)local_94 * 2)) {
        if (pdVar11[local_94] + (double)row_ep < *(double *)(&row_ap->size + (long)local_94 * 2)) {
          *(undefined4 *)
           ((long)&(((vector<double,_std::allocator<double>_> *)in_RDI->dblOption)->
                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 4) = 7;
        }
      }
      else {
        *(undefined4 *)
         ((long)&(((vector<double,_std::allocator<double>_> *)in_RDI->dblOption)->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 4) = 7;
      }
    }
    HVector::clear((HVector *)in_RDI);
    HVector::clear((HVector *)in_RDI);
    *(undefined4 *)((long)((vector<double,_std::allocator<double>_> *)in_RDI->dblOption + 1) + 0xc)
         = 1;
    vVar18 = *(value_type *)
              ((long)((vector<double,_std::allocator<double>_> *)in_RDI->dblOption + 1) + 4);
    pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)
                         ((long)((vector<double,_std::allocator<double>_> *)in_RDI->dblOption + 1) +
                         0x10),0);
    *pvVar14 = vVar18;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)&in_RDI->field_0x60,
                         (long)*(int *)((long)((vector<double,_std::allocator<double>_> *)
                                               in_RDI->dblOption + 1) + 4));
    *pvVar13 = 1.0;
    *(undefined1 *)((long)((vector<int,_std::allocator<int>_> *)(in_RDI->timer).itemStart + 2) + 8)
         = 1;
    HModel::getFactor(*(HModel **)(in_RDI->intOption + 6));
    HFactor::btran((HFactor *)CONCAT44(vVar18,in_stack_ffffffffffffff30),
                   (HVector *)in_stack_ffffffffffffff28,(double)in_stack_ffffffffffffff20);
    HModel::getMatrix(*(HModel **)(in_RDI->intOption + 6));
    HMatrix::price_by_row(this_00,row_ap,row_ep);
    *(double *)&(in_RDI->timer).field_0x1f0 =
         *(double *)&(in_RDI->timer).field_0x1f0 * 0.95 +
         ((double)*(int *)((long)((vector<double,_std::allocator<double>_> *)in_RDI->dblOption + 1)
                          + 0xc) * 0.05) /
         (double)*(int *)((long)&(((vector<double,_std::allocator<double>_> *)in_RDI->dblOption)->
                                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                 super__Vector_impl_data._M_start + 4);
    pHVar17 = (HModel *)
              (pdVar7[*(int *)((vector<double,_std::allocator<double>_> *)in_RDI->dblOption + 1)] /
              dVar1);
    for (iVar19 = 0;
        iVar19 < *(int *)((long)((vector<int,_std::allocator<int>_> *)(in_RDI->timer).itemStart + 4)
                         + 0x14); iVar19 = iVar19 + 1) {
      in_stack_ffffffffffffff28 = pHVar17;
      pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI->timer).itemStart + 5,
                           (long)iVar19);
      iVar5 = *pvVar14;
      pHVar17 = in_stack_ffffffffffffff28;
      pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)
                           ((vector<int,_std::allocator<int>_> *)(in_RDI->timer).itemStart + 6),
                           (long)iVar5);
      pdVar7[iVar5] = -(double)in_stack_ffffffffffffff28 * *pvVar13 + pdVar7[iVar5];
    }
    for (iVar19 = 0; iVar19 < *(int *)((long)in_RDI->dblOption + 0x24); iVar19 = iVar19 + 1) {
      in_stack_ffffffffffffff20 = pHVar17;
      pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI->dblOption + 5),(long)iVar19
                          );
      iVar5 = *pvVar14 + *(int *)in_RDI->dblOption;
      pHVar17 = in_stack_ffffffffffffff20;
      pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)&in_RDI->field_0x60,
                           (long)*pvVar14);
      pdVar7[iVar5] = -(double)in_stack_ffffffffffffff20 * *pvVar13 + pdVar7[iVar5];
    }
    pdVar7[*(int *)(in_RDI->dblOption + 3)] = 0.0;
    pdVar7[iVar3] = -(double)pHVar17;
    HModel::updateFactor
              (in_RDI,in_stack_ffffffffffffff38,
               (HVector *)CONCAT44(vVar18,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28->intOption,in_stack_ffffffffffffff20->intOption);
    HModel::updateMatrix
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
    iVar19 = *(int *)(in_RDI->dblOption + 2) + 1;
    *(int *)(in_RDI->dblOption + 2) = iVar19;
    if (*(int *)((long)in_RDI->dblOption + 0xc) <= iVar19) {
      *(undefined4 *)((long)in_RDI->dblOption + 0x14) = 1;
    }
    HModel::recordPivots
              ((HModel *)CONCAT44(vVar18,in_stack_ffffffffffffff30),
               (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),(int)in_stack_ffffffffffffff28,
               (double)in_stack_ffffffffffffff20);
  }
  return;
}

Assistant:

void HPrimal::primalUpdate() {
    int *jMove = model->getNonbasicMove();
    double *workDual = model->getWorkDual();
    const double *workLower = model->getWorkLower();
    const double *workUpper = model->getWorkUpper();
    const double *baseLower = model->getBaseLower();
    const double *baseUpper = model->getBaseUpper();
    double *workValue = model->getWorkValue();
    double *baseValue = model->getBaseValue();
    const double primalTolerance = model->dblOption[DBLOPT_PRIMAL_TOL];

    // Compute thetaPrimal
    int moveIn = jMove[columnIn];
    int columnOut = model->getBaseIndex()[rowOut];
    double alpha = column.array[rowOut];
    double thetaPrimal = 0;
    if (alpha * moveIn > 0) {
        // Lower bound
        thetaPrimal = (baseValue[rowOut] - baseLower[rowOut]) / alpha;
    } else {
        // Upper bound
        thetaPrimal = (baseValue[rowOut] - baseUpper[rowOut]) / alpha;
    }

    // 1. Make sure it is inside bounds or just flip bound
    double lowerIn = workLower[columnIn];
    double upperIn = workUpper[columnIn];
    double valueIn = workValue[columnIn] + thetaPrimal;
    bool flipped = false;
    if (jMove[columnIn] == 1) {
        if (valueIn > upperIn + primalTolerance) {
            // Flip to upper
            workValue[columnIn] = upperIn;
            thetaPrimal = upperIn - lowerIn;
            flipped = true;
            jMove[columnIn] = -1;
        }
    } else if (jMove[columnIn] == -1) {
        if (valueIn < lowerIn - primalTolerance) {
            // Flip to lower
            workValue[columnIn] = lowerIn;
            thetaPrimal = lowerIn - upperIn;
            flipped = true;
            jMove[columnIn] = 1;
        }
    }

    for (int i = 0; i < column.count; i++) {
        int index = column.index[i];
        baseValue[index] -= thetaPrimal * column.array[index];
    }

    // If flipped, then no need touch the pivots
    if (flipped) {
        return;
    }

    // Pivot in
    int sourceOut = alpha * moveIn > 0 ? -1 : 1;
    model->updatePivots(columnIn, rowOut, sourceOut);

    baseValue[rowOut] = valueIn;

    // Check for any possible infeasible
    for (int iRow = 0; iRow < numRow; iRow++) {
        if (baseValue[iRow] < baseLower[iRow] - primalTolerance) {
	  invertHint = invertHint_primalInfeasibleInPrimalSimplex; //Was 1
        } else if (baseValue[iRow] > baseUpper[iRow] + primalTolerance) {
	  invertHint = invertHint_primalInfeasibleInPrimalSimplex; //Was 1
        }
    }

    // 2. Now we can update the dual
    row_ep.clear();
    row_ap.clear();
    row_ep.count = 1;
    row_ep.index[0] = rowOut;
    row_ep.array[rowOut] = 1;
    row_ep.packFlag = true;
    model->getFactor()->btran(row_ep, row_epDensity);
    model->getMatrix()->price_by_row(row_ap, row_ep);
    row_epDensity = 0.95 * row_epDensity + 0.05 * row_ep.count / numRow;

    double thetaDual = workDual[columnIn] / alpha;
    for (int i = 0; i < row_ap.count; i++) {
        int iCol = row_ap.index[i];
        workDual[iCol] -= thetaDual * row_ap.array[iCol];
    }
    for (int i = 0; i < row_ep.count; i++) {
        int iGet = row_ep.index[i];
        int iCol = iGet + numCol;
        workDual[iCol] -= thetaDual * row_ep.array[iGet];
    }

    // Dual for the pivot
    workDual[columnIn] = 0;
    workDual[columnOut] = -thetaDual;

    // Update model->factor basis
    model->updateFactor(&column, &row_ep, &rowOut, &invertHint);
    model->updateMatrix(columnIn, columnOut);
    if (++countUpdate >= limitUpdate)
      invertHint = invertHint_updateLimitReached; // Was true;

    model->recordPivots(columnIn, columnOut, alpha);
}